

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_UnknownEdition_Test::TestBody
          (ParseEditionsTest_UnknownEdition_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38
  ;
  string_view local_20;
  ParseEditionsTest_UnknownEdition_Test *local_10;
  ParseEditionsTest_UnknownEdition_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "\n        edition = \"UNKNOWN\";\n        message A {\n          optional int32 b = 1;\n        }"
            );
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_38,"1:18: Unknown edition \"UNKNOWN\".\n");
  ParserTest::ExpectHasEarlyExitErrors(&this->super_ParseEditionsTest,local_20,&local_38);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_38);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, UnknownEdition) {
  ExpectHasEarlyExitErrors(
      R"schema(
        edition = "UNKNOWN";
        message A {
          optional int32 b = 1;
        })schema",
      "1:18: Unknown edition \"UNKNOWN\".\n");
}